

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompiledEvalInternal
              (xmlXPathCompExprPtr comp,xmlXPathContextPtr ctxt,xmlXPathObjectPtr *resObjPtr,
              int toBool)

{
  xmlGenericErrorFunc p_Var1;
  xmlXPathParserContextPtr ctxt_00;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlXPathObjectPtr pxStack_40;
  int res;
  xmlXPathObjectPtr resObj;
  xmlXPathParserContextPtr pctxt;
  int toBool_local;
  xmlXPathObjectPtr *resObjPtr_local;
  xmlXPathContextPtr ctxt_local;
  xmlXPathCompExprPtr comp_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0xc,1,XML_ERR_FATAL,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                    ,0x37f2,(char *)0x0,(char *)0x0,(char *)0x0,0,0,"NULL context pointer\n");
    comp_local._4_4_ = -1;
  }
  else if (comp == (xmlXPathCompExprPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    ctxt_00 = xmlXPathCompParserContext(comp,ctxt);
    comp_local._4_4_ = xmlXPathRunEval(ctxt_00,toBool);
    if (ctxt_00->error == 0) {
      pxStack_40 = valuePop(ctxt_00);
      if (pxStack_40 == (xmlXPathObjectPtr)0x0) {
        if (toBool == 0) {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"xmlXPathCompiledEval: No result on the stack.\n");
        }
      }
      else if (0 < ctxt_00->valueNr) {
        pp_Var2 = __xmlGenericError();
        p_Var1 = *pp_Var2;
        ppvVar3 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar3,"xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                  (ulong)(uint)ctxt_00->valueNr);
      }
    }
    else {
      pxStack_40 = (xmlXPathObjectPtr)0x0;
    }
    if (resObjPtr == (xmlXPathObjectPtr *)0x0) {
      xmlXPathReleaseObject(ctxt,pxStack_40);
    }
    else {
      *resObjPtr = pxStack_40;
    }
    ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
    xmlXPathFreeParserContext(ctxt_00);
  }
  return comp_local._4_4_;
}

Assistant:

static int
xmlXPathCompiledEvalInternal(xmlXPathCompExprPtr comp,
			     xmlXPathContextPtr ctxt,
			     xmlXPathObjectPtr *resObjPtr,
			     int toBool)
{
    xmlXPathParserContextPtr pctxt;
    xmlXPathObjectPtr resObj;
#ifndef LIBXML_THREAD_ENABLED
    static int reentance = 0;
#endif
    int res;

    CHECK_CTXT_NEG(ctxt)

    if (comp == NULL)
	return(-1);
    xmlInitParser();

#ifndef LIBXML_THREAD_ENABLED
    reentance++;
    if (reentance > 1)
	xmlXPathDisableOptimizer = 1;
#endif

#ifdef DEBUG_EVAL_COUNTS
    comp->nb++;
    if ((comp->string != NULL) && (comp->nb > 100)) {
	fprintf(stderr, "100 x %s\n", comp->string);
	comp->nb = 0;
    }
#endif
    pctxt = xmlXPathCompParserContext(comp, ctxt);
    res = xmlXPathRunEval(pctxt, toBool);

    if (pctxt->error != XPATH_EXPRESSION_OK) {
        resObj = NULL;
    } else {
        resObj = valuePop(pctxt);
        if (resObj == NULL) {
            if (!toBool)
                xmlGenericError(xmlGenericErrorContext,
                    "xmlXPathCompiledEval: No result on the stack.\n");
        } else if (pctxt->valueNr > 0) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                pctxt->valueNr);
        }
    }

    if (resObjPtr)
        *resObjPtr = resObj;
    else
        xmlXPathReleaseObject(ctxt, resObj);

    pctxt->comp = NULL;
    xmlXPathFreeParserContext(pctxt);
#ifndef LIBXML_THREAD_ENABLED
    reentance--;
#endif

    return(res);
}